

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O0

QBitArray *
performBitwiseOperationInPlace<std::bit_and<unsigned_char>>(QBitArray *param_1,undefined8 param_2)

{
  qsizetype size;
  qsizetype qVar1;
  QBitArray *pQVar2;
  QBitArray *in_stack_ffffffffffffffd0;
  QBitArray *in_stack_ffffffffffffffe0;
  
  size = QBitArray::size(in_stack_ffffffffffffffd0);
  qVar1 = QBitArray::size(in_stack_ffffffffffffffd0);
  if (size < qVar1) {
    QBitArray::size(param_1);
    QBitArray::resize(in_stack_ffffffffffffffe0,size);
  }
  pQVar2 = performBitwiseOperationHelper<std::bit_and<unsigned_char>>(param_1,param_1,param_2);
  return pQVar2;
}

Assistant:

Q_NEVER_INLINE static
QBitArray &performBitwiseOperationInPlace(QBitArray &self, const QBitArray &other, BitwiseOp op)
{
    if (self.size() < other.size())
        self.resize(other.size());
    return performBitwiseOperationHelper(self, self, other, op);
}